

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O2

void __thiscall
t_swift_generator::generate_swift_service_client_recv_function_implementation
          (t_swift_generator *this,ostream *out,t_service *tservice,t_function *tfunction,
          bool needs_protocol)

{
  string *psVar1;
  int *piVar2;
  t_struct *ptVar3;
  int iVar4;
  ostream *poVar5;
  string *psVar6;
  char *pcVar7;
  pointer pptVar8;
  string resultname;
  string return_type_name;
  
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"private func recv_");
  psVar1 = &tfunction->name_;
  poVar5 = std::operator<<(poVar5,(string *)psVar1);
  std::operator<<(poVar5,"(");
  if (this->gen_cocoa_ == false) {
    if (needs_protocol) {
      std::operator<<(out,"on inProtocol: TProtocol");
    }
    std::operator<<(out,") throws");
    iVar4 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar4 == '\0') {
      poVar5 = std::operator<<(out," -> ");
      type_name_abi_cxx11_(&resultname,this,tfunction->returntype_,false,false);
      std::operator<<(poVar5,(string *)&resultname);
      std::__cxx11::string::~string((string *)&resultname);
    }
    block_open(this,out);
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"try inProtocol.readResultMessageBegin() ");
    psVar6 = &::endl_abi_cxx11_;
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    function_result_helper_struct_type_abi_cxx11_
              (&resultname,(t_swift_generator *)psVar6,tservice,tfunction);
    t_generator::indent((t_generator *)this,out);
    iVar4 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])();
    if (((char)iVar4 == '\0') ||
       ((tfunction->xceptions_->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (tfunction->xceptions_->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      pcVar7 = "let result = ";
    }
    else {
      pcVar7 = "_ = ";
    }
    std::operator<<(out,pcVar7);
    type_name_abi_cxx11_(&return_type_name,this,tfunction->returntype_,false,false);
    poVar5 = std::operator<<(out,"try ");
    poVar5 = std::operator<<(poVar5,(string *)&resultname);
    poVar5 = std::operator<<(poVar5,".read(from: inProtocol)");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"try inProtocol.readMessageEnd()");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    iVar4 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar4 == '\0') {
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::operator<<(poVar5,"if let success = result.success");
      block_open(this,out);
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"return success");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      block_close(this,out,true);
    }
    ptVar3 = tfunction->xceptions_;
    for (pptVar8 = (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar8 !=
        (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar8 = pptVar8 + 1) {
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"if let ");
      poVar5 = std::operator<<(poVar5,(string *)&(*pptVar8)->name_);
      poVar5 = std::operator<<(poVar5," = result.");
      std::operator<<(poVar5,(string *)&(*pptVar8)->name_);
      block_open(this,out);
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"throw ");
      poVar5 = std::operator<<(poVar5,(string *)&(*pptVar8)->name_);
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      block_close(this,out,true);
    }
    iVar4 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar4 == '\0') {
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"throw TApplicationError(error: .missingResult(methodName: \""
                              );
      poVar5 = std::operator<<(poVar5,(string *)psVar1);
      poVar5 = std::operator<<(poVar5,"\"))");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    }
    std::__cxx11::string::~string((string *)&return_type_name);
  }
  else {
    if (needs_protocol) {
      std::operator<<(out,"__inProtocol: TProtocol");
    }
    std::operator<<(out,") throws");
    iVar4 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar4 == '\0') {
      poVar5 = std::operator<<(out," -> ");
      type_name_abi_cxx11_(&resultname,this,tfunction->returntype_,false,false);
      std::operator<<(poVar5,(string *)&resultname);
      std::__cxx11::string::~string((string *)&resultname);
    }
    block_open(this,out);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"try __inProtocol.readResultMessageBegin() ");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    psVar6 = &::endl_abi_cxx11_;
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    function_result_helper_struct_type_abi_cxx11_
              (&resultname,(t_swift_generator *)psVar6,tservice,tfunction);
    t_generator::indent((t_generator *)this,out);
    iVar4 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])();
    if (((char)iVar4 == '\0') ||
       ((tfunction->xceptions_->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (tfunction->xceptions_->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      std::operator<<(out,"let __result = ");
    }
    poVar5 = std::operator<<(out,"try ");
    poVar5 = std::operator<<(poVar5,(string *)&resultname);
    poVar5 = std::operator<<(poVar5,".readValueFromProtocol(__inProtocol)");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"try __inProtocol.readMessageEnd()");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    iVar4 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar4 == '\0') {
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::operator<<(poVar5,"if let __success = __result.success");
      block_open(this,out);
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"return __success");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      block_close(this,out,true);
    }
    ptVar3 = tfunction->xceptions_;
    for (pptVar8 = (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar8 !=
        (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar8 = pptVar8 + 1) {
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"if let ");
      poVar5 = std::operator<<(poVar5,(string *)&(*pptVar8)->name_);
      poVar5 = std::operator<<(poVar5," = __result.");
      std::operator<<(poVar5,(string *)&(*pptVar8)->name_);
      block_open(this,out);
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"throw ");
      poVar5 = std::operator<<(poVar5,(string *)&(*pptVar8)->name_);
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      block_close(this,out,true);
    }
    iVar4 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar4 == '\0') {
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"throw NSError(");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar2 = *piVar2 + 1;
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"domain: TApplicationErrorDomain, ");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"code: Int(TApplicationError.MissingResult.rawValue),");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"userInfo: [TApplicationErrorMethodKey: \"");
      poVar5 = std::operator<<(poVar5,(string *)psVar1);
      poVar5 = std::operator<<(poVar5,"\"])");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar2 = *piVar2 + -1;
    }
  }
  std::__cxx11::string::~string((string *)&resultname);
  block_close(this,out,true);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_swift_generator::generate_swift_service_client_recv_function_implementation(ostream& out,
                                                                                   t_service* tservice,
                                                                                   t_function* tfunction,
                                                                                   bool needs_protocol) {

  // Open function
  indent(out) << "private func recv_" << tfunction->get_name() << "(";
  if (!gen_cocoa_) {
    if (needs_protocol) {
      out << "on inProtocol: TProtocol";
    }
    out << ") throws";
    if (!tfunction->get_returntype()->is_void()) {
      out << " -> " << type_name(tfunction->get_returntype());
    }

    block_open(out);

    // check for an exception

    indent(out) << "try inProtocol.readResultMessageBegin() " << endl;

    string resultname = function_result_helper_struct_type(tservice, tfunction);
    indent(out);
    if (!tfunction->get_returntype()->is_void() || !tfunction->get_xceptions()->get_members().empty()) {
      out << "let result = ";
    } else {
      out << "_ = ";
    }

    string return_type_name = type_name(tfunction->get_returntype());
    out << "try " << resultname << ".read(from: inProtocol)" << endl;

    indent(out) << "try inProtocol.readMessageEnd()" << endl << endl;

    // Careful, only return _result if not a void function
    if (!tfunction->get_returntype()->is_void()) {
      indent(out) << "if let success = result.success";
      block_open(out);
      indent(out) << "return success" << endl;
      block_close(out);
    }

    t_struct* xs = tfunction->get_xceptions();
    const vector<t_field*>& xceptions = xs->get_members();
    vector<t_field*>::const_iterator x_iter;

    for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
      indent(out) << "if let " << (*x_iter)->get_name() << " = result." << (*x_iter)->get_name();
      block_open(out);
      indent(out) << "throw " << (*x_iter)->get_name() << endl;
      block_close(out);
    }

    // If you get here it's an exception, unless a void function
    if (!tfunction->get_returntype()->is_void()) {
      indent(out) << "throw TApplicationError(error: .missingResult(methodName: \""
                  << tfunction->get_name() << "\"))" << endl;
    }
  } else {
    if (needs_protocol) {
      out << "__inProtocol: TProtocol";
    }

    out << ") throws";

    if (!tfunction->get_returntype()->is_void()) {
      out << " -> " << type_name(tfunction->get_returntype());
    }

    block_open(out);

    // check for an exception
    out << endl;
    indent(out) << "try __inProtocol.readResultMessageBegin() " << endl << endl;
    string resultname = function_result_helper_struct_type(tservice, tfunction);
    indent(out);
    if (!tfunction->get_returntype()->is_void() || !tfunction->get_xceptions()->get_members().empty()) {
      out << "let __result = ";
    }
    out << "try " << resultname << ".readValueFromProtocol(__inProtocol)" << endl << endl;

    indent(out) << "try __inProtocol.readMessageEnd()" << endl << endl;

    // Careful, only return _result if not a void function
    if (!tfunction->get_returntype()->is_void()) {
      indent(out) << "if let __success = __result.success";
      block_open(out);
      indent(out) << "return __success" << endl;
      block_close(out);
    }

    t_struct* xs = tfunction->get_xceptions();
    const vector<t_field*>& xceptions = xs->get_members();
    vector<t_field*>::const_iterator x_iter;

    for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
      indent(out) << "if let " << (*x_iter)->get_name() << " = __result." << (*x_iter)->get_name();
      block_open(out);
      indent(out) << "throw " << (*x_iter)->get_name() << endl;
      block_close(out);
    }

    // If you get here it's an exception, unless a void function
    if (!tfunction->get_returntype()->is_void()) {
      indent(out) << "throw NSError(" << endl;
      indent_up();
      indent(out) << "domain: TApplicationErrorDomain, " << endl;
      indent(out) << "code: Int(TApplicationError.MissingResult.rawValue)," << endl;
      indent(out) << "userInfo: [TApplicationErrorMethodKey: \"" << tfunction->get_name() << "\"])" << endl;
      indent_down();
    }
  }

  // Close function
  block_close(out);
  out << endl;
}